

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall PeleLM::velocity_diffusion_update(PeleLM *this,Real dt)

{
  ostringstream *this_00;
  pointer pSVar1;
  Diffusion *this_01;
  FluxBoxes betanp1;
  FluxBoxes betan;
  TimeCenter TVar2;
  MultiFab *rho_half;
  bool bVar3;
  double dVar4;
  char local_1e1;
  Real local_1e0;
  Real local_1d8;
  FluxBoxes fb_betanp1;
  FluxBoxes fb_betan;
  Print local_1b8;
  
  if (*NavierStokesBase::is_diffusive.super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start != 0)
  {
    local_1d8 = dt;
    dVar4 = amrex::ParallelDescriptor::second();
    pSVar1 = (this->super_NavierStokesBase).super_AmrLevel.state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    TVar2 = amrex::StateDescriptor::timeType(pSVar1->desc);
    if (TVar2 == Point) {
      local_1e0 = (pSVar1->old_time).stop;
    }
    else {
      local_1e0 = ((pSVar1->old_time).start + (pSVar1->old_time).stop) * 0.5;
    }
    bVar3 = NavierStokesBase::do_mom_diff != 0;
    fb_betan.data = (MultiFab **)0x0;
    FluxBoxes::define(&fb_betan,(AmrLevel *)this,1,0);
    fb_betanp1.data = (MultiFab **)0x0;
    FluxBoxes::define(&fb_betanp1,(AmrLevel *)this,1,0);
    betan = fb_betan;
    betanp1 = fb_betanp1;
    (*(this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x32])
              (local_1e0,this,fb_betan.data);
    (*(this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x32])
              (local_1e0 + local_1d8,this,betanp1.data);
    this_01 = (this->super_NavierStokesBase).diffusion;
    local_1e0 = NavierStokesBase::be_cn_theta;
    rho_half = NavierStokesBase::get_rho_half_time(&this->super_NavierStokesBase);
    Diffusion::diffuse_velocity
              (this_01,local_1d8,local_1e0,rho_half,(uint)bVar3 * 2 + 1,(MultiFab *)0x0,0,betan.data
               ,(this->super_NavierStokesBase).viscn_cc,betanp1.data,
               (this->super_NavierStokesBase).viscnp1_cc,0);
    if (2 < NavierStokesBase::verbose) {
      local_1d8 = amrex::ParallelDescriptor::second();
      local_1b8.os = amrex::OutStream();
      local_1b8.rank = *(int *)(DAT_00816950 + -0x30);
      this_00 = &local_1b8.ss;
      local_1b8.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
           *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"      PeleLM::velocity_diffusion_update(): lev: ",0x30);
      std::ostream::operator<<(this_00,(this->super_NavierStokesBase).super_AmrLevel.level);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", time: ",8);
      std::ostream::_M_insert<double>(local_1d8 - dVar4);
      local_1e1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,&local_1e1,1);
      amrex::Print::~Print(&local_1b8);
    }
    FluxBoxes::clear(&fb_betanp1);
    FluxBoxes::clear(&fb_betan);
  }
  return;
}

Assistant:

void
PeleLM::velocity_diffusion_update (Real dt)
{
   BL_PROFILE("PLM::velocity_diffusion_update()");
   //
   // Do implicit c-n solve for velocity
   // compute the viscous forcing
   // do following except at initial iteration--rbp, per jbb
   //
   if (is_diffusive[Xvel])
   {
      const Real strt_time = ParallelDescriptor::second();

      const Real time = state[State_Type].prevTime();

      int rho_flag;
      if (do_mom_diff == 0)
      {
         rho_flag = 1;
      }
      else
      {
         rho_flag = 3;
      }

      MultiFab *delta_rhs = 0;

      FluxBoxes fb_betan(this,1,0);
      FluxBoxes fb_betanp1(this,1,0);
      MultiFab** betan = fb_betan.get();
      MultiFab** betanp1 = fb_betanp1.get();
      getViscosity(betan, time);
      getViscosity(betanp1, time+dt);

      int rhsComp  = 0;
      int betaComp = 0;
      diffusion->diffuse_velocity(dt,be_cn_theta,get_rho_half_time(),rho_flag,
                                  delta_rhs,rhsComp,betan,viscn_cc,
                                  betanp1,viscnp1_cc,betaComp);

      delete delta_rhs;

      if (verbose > 2)
      {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - strt_time;

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

        amrex::Print() << "      PeleLM::velocity_diffusion_update(): lev: " << level
                       << ", time: " << run_time << '\n';
      }
  }
}